

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_get_data(crnd_unpack_context pContext,void **ppData,uint32 *pData_size)

{
  bool bVar1;
  uint32 uVar2;
  void *pvVar3;
  crn_unpacker *pUnpacker;
  uint32 *pData_size_local;
  void **ppData_local;
  crnd_unpack_context pContext_local;
  
  if (pContext == (crnd_unpack_context)0x0) {
    pContext_local._7_1_ = false;
  }
  else {
    bVar1 = crn_unpacker::is_valid((crn_unpacker *)pContext);
    if (bVar1) {
      if (ppData != (void **)0x0) {
        pvVar3 = crn_unpacker::get_data((crn_unpacker *)pContext);
        *ppData = pvVar3;
      }
      if (pData_size != (uint32 *)0x0) {
        uVar2 = crn_unpacker::get_data_size((crn_unpacker *)pContext);
        *pData_size = uVar2;
      }
      pContext_local._7_1_ = true;
    }
    else {
      pContext_local._7_1_ = false;
    }
  }
  return pContext_local._7_1_;
}

Assistant:

bool crnd_get_data(crnd_unpack_context pContext, const void** ppData, uint32* pData_size)
    {
        if (!pContext)
            return false;

        crn_unpacker* pUnpacker = static_cast<crn_unpacker*>(pContext);

        if (!pUnpacker->is_valid())
            return false;

        if (ppData)
            *ppData = pUnpacker->get_data();

        if (pData_size)
            *pData_size = pUnpacker->get_data_size();

        return true;
    }